

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O1

Vector2d __thiscall
VehicleState::Propagator::GetRangeAndRate(Propagator *this,Vector3d *pos_station_ecef,double tof)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *in_RDX;
  long lVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Vector2d VVar13;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  matvec;
  Matrix3d R_ecef2eci;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_298;
  undefined1 local_278 [16];
  double local_268;
  ulong uStack_260;
  double local_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  undefined1 local_238 [16];
  double local_228;
  ulong uStack_220;
  double local_218;
  double local_210;
  Matrix3d local_208;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double dStack_198;
  double local_190;
  double local_188;
  double dStack_180;
  double local_178;
  pointer local_170;
  double *local_168;
  pointer local_160;
  undefined8 local_158;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  ulong uStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  undefined1 local_108 [16];
  Matrix3d local_f8;
  Matrix3d local_a8;
  Matrix3d local_60;
  
  local_108._8_4_ = in_XMM0_Dc;
  local_108._0_8_ = tof;
  local_108._12_4_ = in_XMM0_Dd;
  dVar3 = pos_station_ecef[0xb].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1];
  local_278._0_8_ =
       pos_station_ecef[0xb].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
       m_data.array[0];
  local_228 = pos_station_ecef[8].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1];
  uStack_220 = 0;
  local_128 = (pos_station_ecef->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
              m_storage.m_data.array[1];
  dStack_120 = (pos_station_ecef->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
               m_storage.m_data.array[2];
  local_218 = pos_station_ecef[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0];
  local_118 = pos_station_ecef[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1];
  dStack_110 = pos_station_ecef[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2];
  local_210 = pos_station_ecef[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0];
  local_298.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x120);
  local_298.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_298.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  lVar8 = 0;
  do {
    *(undefined8 *)
     ((long)((local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar8) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_298.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar8 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar8 + 0x18) = 0;
    *(undefined8 *)
     ((long)((local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar8 + 0x20) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_298.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar8 + 0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar8 + 0x38) = 0;
    *(undefined8 *)
     ((long)((local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar8 + 0x40) = 0x3ff0000000000000;
    lVar8 = lVar8 + 0x48;
  } while (lVar8 != 0x120);
  local_298.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_298.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  dVar10 = pos_station_ecef[10].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[2];
  Util::ECEF2ECI(&local_f8,dVar3 + (double)local_278._0_8_ / 86400.0,
                 *(MatrixXd **)((long)dVar10 + 0x70),*(MatrixXd **)((long)dVar10 + 0x78),&local_298)
  ;
  dVar3 = *in_RDX;
  dVar10 = in_RDX[1];
  dVar11 = in_RDX[2];
  local_258 = local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[6] * dVar11;
  dStack_250 = local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[7] * dVar11;
  local_248 = dVar11 * local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[8] +
              dVar10 * local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[5];
  dStack_240 = 0.0;
  local_268 = local_228 *
              (local_298.
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3].
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [6] * dVar11 +
              local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
              * dVar10 +
              local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
              * dVar3);
  local_278._0_8_ =
       -local_228 *
       (local_298.
        super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] *
        dVar11 + local_298.
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [4] * dVar10 +
                 local_298.
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [1] * dVar3);
  local_148 = local_228 * local_268;
  local_228 = local_228 * (double)local_278._0_8_;
  local_278._8_8_ = uStack_220 ^ 0x8000000000000000;
  uStack_260 = uStack_220;
  local_148 = 0.0 - local_148;
  uStack_140 = 0;
  local_138 = local_268 * 0.0 + (double)local_278._0_8_ * -0.0;
  uStack_130 = uStack_220;
  lVar8 = 0x58;
  do {
    dVar11 = *(double *)
              ((long)((local_298.
                       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                     array + lVar8 + -0x10);
    dVar12 = *(double *)
              ((long)((local_298.
                       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                     array + lVar8 + -8);
    dVar4 = *(double *)
             ((long)((local_298.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar8);
    dVar5 = ((local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1];
    dVar6 = ((local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4];
    dVar7 = ((local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7];
    *(double *)((long)&local_210 + lVar8) =
         dVar4 * ((local_298.
                   super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                 array[6] +
         dVar12 * ((local_298.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                  array[3] +
         ((local_298.
           super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] *
         dVar11;
    *(double *)
     ((long)local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar8) = dVar4 * dVar7 + dVar12 * dVar6 + dVar5 * dVar11;
    pdVar2 = (double *)
             ((long)((local_298.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar8 + -0x10);
    *(double *)
     ((long)local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar8 + 8) =
         ((local_298.
           super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] *
         pdVar2[1] +
         ((local_298.
           super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] *
         *(double *)
          ((long)((local_298.
                   super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                 array + lVar8) +
         ((local_298.
           super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] *
         *pdVar2;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0xa0);
  local_238._0_8_ =
       local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * dVar3 +
       local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3] * dVar10;
  local_238._8_8_ =
       local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * dVar3 +
       local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] * dVar10;
  local_170 = local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2;
  local_158 = 3;
  lVar8 = 0;
  do {
    dVar10 = *(double *)
              ((long)local_298.
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array + lVar8);
    dVar11 = *(double *)
              ((long)local_298.
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array + lVar8 + 8);
    dVar12 = *(double *)
              ((long)local_298.
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array + lVar8 + 0x10);
    *(double *)
     ((long)local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar8) = dVar12 * local_188 + dVar11 * dStack_1a0 + dVar10 * local_1b8;
    *(double *)
     ((long)local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar8 + 8) = dVar12 * dStack_180 + dVar11 * dStack_198 + dVar10 * dStack_1b0;
    pdVar2 = (double *)
             ((long)local_298.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + lVar8);
    *(double *)
     ((long)local_60.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar8 + 0x10) =
         pdVar2[1] * local_190 +
         *(double *)
          ((long)local_298.
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          + lVar8 + 0x10) * local_178 + *pdVar2 * local_1a8;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x48);
  local_168 = &local_1b8;
  local_160 = local_170;
  Util::OrthoNormMat(&local_208,&local_60);
  dStack_250 = (double)local_238._8_8_ + dStack_250;
  local_238._8_4_ = SUB84(dStack_250,0);
  local_238._0_8_ = (double)local_238._0_8_ + local_258;
  local_238._12_4_ = (int)((ulong)dStack_250 >> 0x20);
  dVar3 = dVar3 * local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[2] + local_248;
  local_258 = local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] * 0.0;
  dStack_250 = local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[7] * 0.0;
  local_248 = local_268 *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3];
  dStack_240 = local_268 *
               local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[4];
  local_268 = local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] * 0.0 +
              local_268 *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5];
  lVar8 = 0x58;
  do {
    dVar10 = *(double *)
              ((long)((local_298.
                       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                     array + lVar8 + -0x10);
    dVar11 = *(double *)
              ((long)((local_298.
                       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                     array + lVar8 + -8);
    dVar12 = *(double *)
              ((long)((local_298.
                       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                     array + lVar8);
    dVar4 = ((local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1];
    dVar5 = ((local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4];
    dVar6 = ((local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7];
    *(double *)((long)&local_210 + lVar8) =
         dVar12 * ((local_298.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                  array[6] +
         dVar11 * ((local_298.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                  array[3] +
         ((local_298.
           super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] *
         dVar10;
    *(double *)
     ((long)local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar8) = dVar12 * dVar6 + dVar11 * dVar5 + dVar4 * dVar10;
    pdVar2 = (double *)
             ((long)((local_298.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar8 + -0x10);
    *(double *)
     ((long)local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar8 + 8) =
         ((local_298.
           super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] *
         pdVar2[1] +
         ((local_298.
           super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] *
         *(double *)
          ((long)((local_298.
                   super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                 array + lVar8) +
         ((local_298.
           super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] *
         *pdVar2;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0xa0);
  local_248 = local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] * (double)local_278._0_8_ + local_248;
  dStack_240 = local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] * (double)local_278._0_8_ + dStack_240;
  uVar9 = local_278._12_4_;
  local_278._8_4_ = local_278._8_4_;
  local_278._0_8_ =
       (double)local_278._0_8_ *
       local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  local_278._12_4_ = uVar9;
  local_170 = local_298.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2;
  local_158 = 3;
  lVar8 = 0;
  do {
    dVar10 = *(double *)
              ((long)local_298.
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array + lVar8);
    dVar11 = *(double *)
              ((long)local_298.
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array + lVar8 + 8);
    dVar12 = *(double *)
              ((long)local_298.
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array + lVar8 + 0x10);
    *(double *)
     ((long)local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar8) = dVar12 * local_188 + dVar11 * dStack_1a0 + dVar10 * local_1b8;
    *(double *)
     ((long)local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar8 + 8) = dVar12 * dStack_180 + dVar11 * dStack_198 + dVar10 * dStack_1b0;
    pdVar2 = (double *)
             ((long)local_298.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + lVar8);
    *(double *)
     ((long)local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar8 + 0x10) =
         pdVar2[1] * local_190 +
         *(double *)
          ((long)local_298.
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          + lVar8 + 0x10) * local_178 + *pdVar2 * local_1a8;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x48);
  local_168 = &local_1b8;
  local_160 = local_170;
  Util::OrthoNormMat(&local_208,&local_a8);
  dVar10 = (double)local_108._0_8_ * (local_248 + local_258) + (local_128 - (double)local_238._0_8_)
  ;
  dVar11 = (double)local_108._0_8_ * (dStack_240 + dStack_250) +
           (dStack_120 - (double)local_238._8_8_);
  dVar12 = ((double)local_278._0_8_ + local_268) * (double)local_108._0_8_ + (local_218 - dVar3);
  dVar3 = ((double)local_108._0_8_ *
           (local_138 *
            local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
           local_228 *
           local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] +
           local_148 *
           local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0]) + (local_118 - (local_248 + local_258))) * dVar10;
  dVar10 = SQRT(dVar12 * dVar12 + dVar11 * dVar11 + dVar10 * dVar10);
  *(double *)this = dVar10;
  (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = (((local_138 *
           local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] +
           local_228 *
           local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] +
          local_148 *
          local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2]) * (double)local_108._0_8_ + (local_210 - ((double)local_278._0_8_ + local_268)))
         * dVar12 +
        ((double)local_108._0_8_ *
         (local_138 *
          local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[7] +
         local_228 *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_148 *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1]) + (dStack_110 - (dStack_240 + dStack_250))) * dVar11 + dVar3) / dVar10;
  if (local_298.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    dVar3 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  }
  VVar13.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       dVar10;
  VVar13.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       dVar3;
  return (Vector2d)
         VVar13.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

Eigen::Vector2d Propagator::GetRangeAndRate(Eigen::Vector3d pos_station_ecef, double tof){

		//locals
		double JD_UTC = this->t_JD_ + this->t_/(24.0*60.0*60.0); //current UTC Julian Date in days
		double earthrot = this->earthrotationspeed_;
		Eigen::Vector3d pos_craft = this->pos_;
		Eigen::Vector3d vel_craft = this->vel_;
		std::vector<Eigen::Matrix3d> matvec(4, Eigen::Matrix3d::Identity(3,3));
		Eigen::Matrix3d R_ecef2eci = Util::ECEF2ECI(JD_UTC, this->gravmodel_->nut80ptr_, this->gravmodel_->iau1980ptr_, &matvec); //matrix rotating from ECEF2ECI


		//convert station position to ECI
		Eigen::Vector3d pos_station = R_ecef2eci*pos_station_ecef;

		//initialize measurement
		Eigen::Vector2d z;

		//station ECI velocity
		// Eigen::Vector3d vel_station;
		// vel_station[0] = -1.0*earthrot*pos_station[1];
		// vel_station[1] = earthrot*pos_station[0];
		// vel_station[2] = 0.0;

		// std::cout << "vel1: \n" << vel_station << "\n";

		// Vallado IAU-76/FK5 transformation for velocity
		//convert station position to PEF 
		Eigen::Vector3d pos_station_pef = matvec[3]*pos_station_ecef;

		//modify earth rate
		double LOD = matvec[4](0,0);
		// earthrot = earthrot*(1.0 - LOD/86400.0);
		Eigen::Vector3d earthrot_vec{0.0, 0.0, earthrot};

		//station PEF velocity
		Eigen::Vector3d vel_station_pef;
		vel_station_pef[0] = -1.0*earthrot*pos_station_pef[1];
		vel_station_pef[1] = earthrot*pos_station_pef[0];
		vel_station_pef[2] = 0.0;

		// //station PEF acceleration
		// Eigen::Vector3d accel_station_pef;
		// accel_station_pef[0] = -1.0*earthrot*earthrot*pos_station_pef[0];
		// accel_station_pef[1] = -1.0*earthrot*earthrot*pos_station_pef[1];
		// accel_station_pef[2] = 0.0;

		// std::cout << accel_station_pef << "\n";

		//station PEF acceleration with a different method specified by vallado
		Eigen::Vector3d accel_station_pef = 1.0*earthrot_vec.cross(vel_station_pef);

		// std::cout << accel_station_pef2 << "\n";

		// exit(0);

		//station ECI velocity
		Eigen::Vector3d vel_station_eci = Util::OrthoNormMat(matvec[0]*matvec[1]*matvec[2])*vel_station_pef;

		//stations ECI accel
		Eigen::Vector3d accel_station_eci = Util::OrthoNormMat(matvec[0]*matvec[1]*matvec[2])*accel_station_pef;

		// std::cout << "vel2: \n" << R_ecef2eci*vel_station_ecef << "\n";

		// exit(0);

		//relative position and velocity
		Eigen::Vector3d rel_pos = pos_craft - pos_station + tof*vel_station_eci;
		Eigen::Vector3d rel_vel  = vel_craft - vel_station_eci + tof*accel_station_eci;

		// std::cout << "Aberation position correction: " << (tof*vel_station_eci).norm() << "\n";
		// exit(0);

		//range
		z[0] = rel_pos.norm();

		//range rate
		z[1] = rel_pos.dot(rel_vel)/z[0];

		return z;

	}